

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O0

void helper_xscmpexpdp(CPUPPCState_conflict *env,uint32_t opcode,ppc_vsr_t *xa,ppc_vsr_t *xb)

{
  int iVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  bool bVar5;
  uintptr_t unaff_retaddr;
  uint32_t local_3c;
  uint32_t cc;
  int64_t exp_b;
  int64_t exp_a;
  ppc_vsr_t *xb_local;
  ppc_vsr_t *xa_local;
  uint32_t opcode_local;
  CPUPPCState_conflict *env_local;
  
  uVar3 = extract64(xa->u64[1],0x34,0xb);
  uVar4 = extract64(xb->u64[1],0x34,0xb);
  iVar1 = float64_is_any_nan(xa->f64[1]);
  bVar5 = true;
  if (iVar1 == 0) {
    iVar1 = float64_is_any_nan(xb->f64[1]);
    bVar5 = iVar1 != 0;
  }
  if (bVar5) {
    local_3c = 1;
  }
  else if ((long)uVar3 < (long)uVar4) {
    local_3c = 8;
  }
  else if ((long)uVar4 < (long)uVar3) {
    local_3c = 4;
  }
  else {
    local_3c = 2;
  }
  env->fpscr = env->fpscr & 0xffff0fff;
  env->fpscr = local_3c << 0xc | env->fpscr;
  uVar2 = BF(opcode);
  env->crf[uVar2] = local_3c;
  do_float_check_status(env,unaff_retaddr);
  return;
}

Assistant:

void helper_xscmpexpdp(CPUPPCState *env, uint32_t opcode,
                       ppc_vsr_t *xa, ppc_vsr_t *xb)
{
    int64_t exp_a, exp_b;
    uint32_t cc;

    exp_a = extract64(xa->VsrD(0), 52, 11);
    exp_b = extract64(xb->VsrD(0), 52, 11);

    if (unlikely(float64_is_any_nan(xa->VsrD(0)) ||
                 float64_is_any_nan(xb->VsrD(0)))) {
        cc = CRF_SO;
    } else {
        if (exp_a < exp_b) {
            cc = CRF_LT;
        } else if (exp_a > exp_b) {
            cc = CRF_GT;
        } else {
            cc = CRF_EQ;
        }
    }

    env->fpscr &= ~FP_FPCC;
    env->fpscr |= cc << FPSCR_FPCC;
    env->crf[BF(opcode)] = cc;

    do_float_check_status(env, GETPC());
}